

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

CaseInsensitiveMultimap * __thiscall
SimpleWeb::HttpHeader::parse_abi_cxx11_
          (CaseInsensitiveMultimap *__return_storage_ptr__,HttpHeader *this,istream *stream)

{
  ulong uVar1;
  istream *piVar2;
  long lVar3;
  ulong uVar4;
  string line;
  string local_70 [32];
  string local_50 [32];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&line);
    if (((&piVar2->field_0x20)[(long)piVar2->_vptr_basic_istream[-3]] & 5) != 0) break;
    lVar3 = std::__cxx11::string::find((char)&line,0x3a);
    if (lVar3 == -1) break;
    uVar1 = lVar3 + 1;
    do {
      uVar4 = uVar1;
      if (line._M_string_length <= uVar4 + 1) break;
      uVar1 = uVar4 + 1;
    } while (line._M_dataplus._M_p[uVar4] == ' ');
    if (uVar4 < line._M_string_length) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&line);
      std::__cxx11::string::substr((ulong)local_70,(ulong)&line);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<std::__cxx11::string,std::__cxx11::string>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)__return_storage_ptr__,local_50,local_70);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
    }
  }
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

static CaseInsensitiveMultimap parse(std::istream &stream) noexcept {
      CaseInsensitiveMultimap result;
      std::string line;
      std::size_t param_end;
      while(getline(stream, line) && (param_end = line.find(':')) != std::string::npos) {
        std::size_t value_start = param_end + 1;
        while(value_start + 1 < line.size() && line[value_start] == ' ')
          ++value_start;
        if(value_start < line.size())
          result.emplace(line.substr(0, param_end), line.substr(value_start, line.size() - value_start - (line.back() == '\r' ? 1 : 0)));
      }
      return result;
    }